

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear_glfw_gl3.h
# Opt level: O2

void nk_glfw3_device_destroy(nk_glfw *glfw)

{
  (*glad_glDetachShader)((glfw->ogl).prog,(glfw->ogl).vert_shdr);
  (*glad_glDetachShader)((glfw->ogl).prog,(glfw->ogl).frag_shdr);
  (*glad_glDeleteShader)((glfw->ogl).vert_shdr);
  (*glad_glDeleteShader)((glfw->ogl).frag_shdr);
  (*glad_glDeleteProgram)((glfw->ogl).prog);
  (*glad_glDeleteTextures)(1,&(glfw->ogl).font_tex);
  (*glad_glDeleteBuffers)(1,&(glfw->ogl).vbo);
  (*glad_glDeleteBuffers)(1,&(glfw->ogl).ebo);
  nk_buffer_free(&(glfw->ogl).cmds);
  return;
}

Assistant:

NK_API void
nk_glfw3_device_destroy(struct nk_glfw* glfw)
{
    struct nk_glfw_device *dev = &glfw->ogl;
    glDetachShader(dev->prog, dev->vert_shdr);
    glDetachShader(dev->prog, dev->frag_shdr);
    glDeleteShader(dev->vert_shdr);
    glDeleteShader(dev->frag_shdr);
    glDeleteProgram(dev->prog);
    glDeleteTextures(1, &dev->font_tex);
    glDeleteBuffers(1, &dev->vbo);
    glDeleteBuffers(1, &dev->ebo);
    nk_buffer_free(&dev->cmds);
}